

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ringbuffer.cpp
# Opt level: O0

size_t __thiscall RingbufferBase::fullRead(RingbufferBase *this,void *buf,size_t sizeInBytes)

{
  ma_uint32 mVar1;
  ssize_t sVar2;
  size_t in_RCX;
  RingbufferBase *local_38;
  size_t bytesRead;
  size_t readAvail;
  size_t sizeInBytes_local;
  void *buf_local;
  RingbufferBase *this_local;
  
  mVar1 = ma_rb_available_read(&this->mRingbuffer);
  if ((RingbufferBase *)(ulong)mVar1 == (RingbufferBase *)0x0) {
    this_local = (RingbufferBase *)0x0;
  }
  else {
    local_38 = (RingbufferBase *)read(this,(int)buf,(void *)sizeInBytes,in_RCX);
    if (((void *)(sizeInBytes - (long)local_38) != (void *)0x0) &&
       ((RingbufferBase *)(ulong)mVar1 != local_38)) {
      sVar2 = read(this,(int)buf + (int)local_38,(void *)(sizeInBytes - (long)local_38),
                   (size_t)local_38);
      local_38 = (RingbufferBase *)(&local_38->mInitialized + sVar2);
    }
    this_local = local_38;
  }
  return (size_t)this_local;
}

Assistant:

size_t RingbufferBase::fullRead(void *buf, size_t sizeInBytes) {
    size_t readAvail = ma_rb_available_read(&mRingbuffer);

    if (readAvail == 0) {
        return 0;
    }

    // do the first read
    size_t bytesRead = read(buf, sizeInBytes);

    sizeInBytes -= bytesRead;
    readAvail -= bytesRead;

    if (sizeInBytes != 0 && readAvail) {
        // do the second read (the read pointer starts at the beginning)
        bytesRead += read(reinterpret_cast<uint8_t*>(buf) + bytesRead, sizeInBytes);

    }

    return bytesRead;
}